

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O3

void TransformColorInverse_SSE2(VP8LMultipliers *m,uint32_t *src,int num_pixels,uint32_t *dst)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [15];
  undefined1 auVar3 [16];
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar12 [16];
  
  auVar3 = _DAT_001275f0;
  uVar6 = 0;
  if (3 < num_pixels) {
    iVar4 = (int)(char)m->red_to_blue;
    auVar8._0_4_ = iVar4 << 0x13;
    auVar8._4_4_ = iVar4 << 0x13;
    auVar8._8_4_ = iVar4 << 0x13;
    auVar8._12_4_ = iVar4 << 0x13;
    iVar4 = (char)m->green_to_red * 0x80000 + ((int)(char)m->green_to_blue & 0x1fffU) * 8;
    auVar9._4_4_ = iVar4;
    auVar9._0_4_ = iVar4;
    auVar9._8_4_ = iVar4;
    auVar9._12_4_ = iVar4;
    uVar5 = 0;
    do {
      auVar1 = *(undefined1 (*) [16])(src + uVar5);
      auVar12 = pshuflw(in_XMM5,auVar1 & auVar3,0xa0);
      auVar12 = pshufhw(auVar12,auVar12,0xa0);
      auVar12 = pmulhw(auVar12,auVar9);
      auVar10[0] = auVar12[0] + auVar1[0];
      auVar10[1] = auVar12[1] + auVar1[1];
      auVar10[2] = auVar12[2] + auVar1[2];
      auVar10[3] = auVar12[3] + auVar1[3];
      auVar10[4] = auVar12[4] + auVar1[4];
      auVar10[5] = auVar12[5] + auVar1[5];
      auVar10[6] = auVar12[6] + auVar1[6];
      auVar10[7] = auVar12[7] + auVar1[7];
      auVar10[8] = auVar12[8] + auVar1[8];
      auVar10[9] = auVar12[9] + auVar1[9];
      auVar10[10] = auVar12[10] + auVar1[10];
      auVar10[0xb] = auVar12[0xb] + auVar1[0xb];
      auVar10[0xc] = auVar12[0xc] + auVar1[0xc];
      auVar10[0xd] = auVar12[0xd] + auVar1[0xd];
      auVar10[0xe] = auVar12[0xe] + auVar1[0xe];
      auVar10[0xf] = auVar12[0xf] + auVar1[0xf];
      in_XMM5 = psllw(auVar10,8);
      auVar10 = pmulhw(in_XMM5,auVar8);
      auVar12._4_4_ = auVar10._12_4_ >> 8;
      auVar12._0_4_ = auVar10._8_4_ >> 8;
      auVar12._8_8_ = 0;
      auVar2._1_14_ = SUB1614(auVar12 << 0x40,2);
      auVar2[0] = auVar10[2] + in_XMM5[1];
      auVar11._2_2_ = (ushort)(((uint)in_XMM5[3] << 0x18) >> 0x18);
      auVar11._0_2_ = auVar2._0_2_;
      auVar11._4_2_ = (ushort)(((uint6)(byte)(auVar10[6] + in_XMM5[5]) << 0x28) >> 0x28);
      auVar11._6_2_ = (ushort)(((ulong)in_XMM5[7] << 0x38) >> 0x38);
      auVar11._8_2_ = (ushort)((uint3)((uint3)(byte)(auVar10[10] + in_XMM5[9]) << 0x10) >> 0x10);
      auVar11._10_2_ = (ushort)(((uint5)in_XMM5[0xb] << 0x20) >> 0x20);
      auVar11._12_2_ = (ushort)(((uint7)(byte)(auVar10[0xe] + in_XMM5[0xd]) << 0x30) >> 0x30);
      auVar11._14_2_ = (ushort)((uint3)((uint3)in_XMM5[0xf] << 0x10) >> 0x10);
      *(undefined1 (*) [16])(dst + uVar5) = auVar11 | auVar1 & auVar3;
      uVar6 = uVar5 + 4;
      uVar7 = uVar5 + 8;
      uVar5 = uVar6;
    } while (uVar7 <= (uint)num_pixels);
  }
  iVar4 = num_pixels - (int)uVar6;
  if (iVar4 == 0) {
    return;
  }
  VP8LTransformColorInverse_C(m,src + (uVar6 & 0xffffffff),iVar4,dst + (uVar6 & 0xffffffff));
  return;
}

Assistant:

static void TransformColorInverse_SSE2(const VP8LMultipliers* const m,
                                       const uint32_t* const src,
                                       int num_pixels, uint32_t* dst) {
// sign-extended multiplying constants, pre-shifted by 5.
#define CST(X)  (((int16_t)(m->X << 8)) >> 5)   // sign-extend
#define MK_CST_16(HI, LO) \
  _mm_set1_epi32((int)(((uint32_t)(HI) << 16) | ((LO) & 0xffff)))
  const __m128i mults_rb = MK_CST_16(CST(green_to_red), CST(green_to_blue));
  const __m128i mults_b2 = MK_CST_16(CST(red_to_blue), 0);
#undef MK_CST_16
#undef CST
  const __m128i mask_ag = _mm_set1_epi32((int)0xff00ff00);  // alpha-green masks
  int i;
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i in = _mm_loadu_si128((const __m128i*)&src[i]); // argb
    const __m128i A = _mm_and_si128(in, mask_ag);     // a   0   g   0
    const __m128i B = _mm_shufflelo_epi16(A, _MM_SHUFFLE(2, 2, 0, 0));
    const __m128i C = _mm_shufflehi_epi16(B, _MM_SHUFFLE(2, 2, 0, 0));  // g0g0
    const __m128i D = _mm_mulhi_epi16(C, mults_rb);    // x dr  x db1
    const __m128i E = _mm_add_epi8(in, D);             // x r'  x   b'
    const __m128i F = _mm_slli_epi16(E, 8);            // r' 0   b' 0
    const __m128i G = _mm_mulhi_epi16(F, mults_b2);    // x db2  0  0
    const __m128i H = _mm_srli_epi32(G, 8);            // 0  x db2  0
    const __m128i I = _mm_add_epi8(H, F);              // r' x  b'' 0
    const __m128i J = _mm_srli_epi16(I, 8);            // 0  r'  0  b''
    const __m128i out = _mm_or_si128(J, A);
    _mm_storeu_si128((__m128i*)&dst[i], out);
  }
  // Fall-back to C-version for left-overs.
  if (i != num_pixels) {
    VP8LTransformColorInverse_C(m, src + i, num_pixels - i, dst + i);
  }
}